

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfenc.c
# Opt level: O0

void ivf_write_frame_header(FILE *outfile,int64_t pts,size_t frame_size)

{
  int in_EDX;
  undefined8 in_RSI;
  FILE *in_RDI;
  char header [12];
  undefined1 local_24 [4];
  undefined1 auStack_20 [4];
  undefined1 auStack_1c [12];
  undefined8 local_10;
  FILE *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mem_put_le32_as_int(local_24,in_EDX);
  mem_put_le32_as_int(auStack_20,(int)local_10);
  mem_put_le32_as_int(auStack_1c,(int)((ulong)local_10 >> 0x20));
  fwrite(local_24,1,0xc,local_8);
  return;
}

Assistant:

void ivf_write_frame_header(FILE *outfile, int64_t pts, size_t frame_size) {
  char header[12];

  mem_put_le32(header, (int)frame_size);
  mem_put_le32(header + 4, (int)(pts & 0xFFFFFFFF));
  mem_put_le32(header + 8, (int)(pts >> 32));
  fwrite(header, 1, 12, outfile);
}